

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

char * subclassname(Fl_Type *l)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar2 = (*l->_vptr_Fl_Type[0x17])();
  if (iVar2 == 0) goto LAB_00183a5b;
  pcVar3 = l[1].user_data_;
  if (pcVar3 == (char *)0x0) {
    iVar2 = (*l->_vptr_Fl_Type[0x26])(l);
    if (iVar2 == 0) {
      if ((char)(l[1].prev)->header_position == -0xf) {
        pcVar3 = "Fl_Double_Window";
      }
      else {
        iVar2 = (*l->_vptr_Fl_Type[5])(l);
        iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"Fl_Input");
        if (iVar2 != 0) {
LAB_00183a5b:
          iVar2 = (*l->_vptr_Fl_Type[5])(l);
          return (char *)CONCAT44(extraout_var_00,iVar2);
        }
        cVar1 = (char)(l[1].prev)->header_position;
        if (cVar1 == '\x01') {
          pcVar3 = "Fl_Float_Input";
        }
        else {
          if (cVar1 != '\x02') goto LAB_00183a5b;
          pcVar3 = "Fl_Int_Input";
        }
      }
    }
    else {
      pcVar3 = "Fl_Group";
    }
  }
  return pcVar3;
}

Assistant:

const char* subclassname(Fl_Type* l) {
  if (l->is_widget()) {
    Fl_Widget_Type* p = (Fl_Widget_Type*)l;
    const char* c = p->subclass();
    if (c) return c;
    if (l->is_class()) return "Fl_Group";
    if (p->o->type() == FL_WINDOW+1) return "Fl_Double_Window";
    if (strcmp(p->type_name(), "Fl_Input") == 0) {
      if (p->o->type() == FL_FLOAT_INPUT) return "Fl_Float_Input";
      if (p->o->type() == FL_INT_INPUT) return "Fl_Int_Input";
    }
  }
  return l->type_name();
}